

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void BlockNotifyGenesisWait(CBlockIndex *pBlockIndex)

{
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock24;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (pBlockIndex != (CBlockIndex *)0x0) {
    local_20._M_device = (mutex_type *)&g_genesis_wait_mutex;
    local_20._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_20);
    fHaveGenesis = 1;
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
    std::condition_variable::notify_all();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void BlockNotifyGenesisWait(const CBlockIndex* pBlockIndex)
{
    if (pBlockIndex != nullptr) {
        {
            LOCK(g_genesis_wait_mutex);
            fHaveGenesis = true;
        }
        g_genesis_wait_cv.notify_all();
    }
}